

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::PathTypeHandlerWithAttr::HasProperty
          (PathTypeHandlerWithAttr *this,DynamicObject *instance,PropertyId propertyId,
          bool *noRedecl,PropertyValueInfo *info)

{
  ObjectSlotAttributes attributes;
  PropertyIndex index;
  BOOL BVar1;
  
  if (noRedecl != (bool *)0x0) {
    *noRedecl = false;
  }
  index = TypePath::LookupInline
                    ((this->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.typePath.ptr,
                     propertyId,
                     (uint)((this->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.
                            super_DynamicTypeHandler.unusedBytes >> 1));
  if (index != 0xffff) {
    attributes = (this->attributes).ptr[index];
    BVar1 = 0;
    if ((attributes & ObjectSlotAttr_Deleted) == ObjectSlotAttr_None) {
      if ((attributes & ObjectSlotAttr_Accessor) == ObjectSlotAttr_None) {
        PathTypeHandlerBase::SetPropertyValueInfo
                  ((PathTypeHandlerBase *)this,info,&instance->super_RecyclableObject,index,
                   attributes);
        BVar1 = 1;
      }
      else {
        BVar1 = 1;
        if (info != (PropertyValueInfo *)0x0) {
          info->m_instance = &instance->super_RecyclableObject;
          info->m_propertyIndex = 0xffff;
          info->m_attributes = '\0';
          info->flags = InlineCacheNoFlags;
        }
      }
    }
    return BVar1;
  }
  BVar1 = PathTypeHandlerBase::HasProperty
                    ((PathTypeHandlerBase *)this,instance,propertyId,noRedecl,info);
  return BVar1;
}

Assistant:

BOOL PathTypeHandlerWithAttr::HasProperty(DynamicObject* instance, PropertyId propertyId, __out_opt bool *noRedecl, _Inout_opt_ PropertyValueInfo* info)
    {
        if (noRedecl != nullptr)
        {
            *noRedecl = false;
        }

        PropertyIndex index = GetTypePath()->LookupInline(propertyId, GetPathLength());
        if (index == Constants::NoSlot)
        {
            return __super::HasProperty(instance, propertyId, noRedecl, info);
        }

        ObjectSlotAttributes attr = attributes[index];

        if (attr & ObjectSlotAttr_Deleted)
        {
            return false;
        }

        if (attr & ObjectSlotAttr_Accessor)
        {
            // PropertyAttributes is only one byte so it can't carry out data about whether this is an accessor.
            // Accessors must be cached differently than normal properties, so if we want to cache this we must
            // do so here rather than in the caller. However, caching here would require passing originalInstance and
            // requestContext through a wide variety of call paths to this point (like we do for GetProperty), for
            // very little improvement. For now, just block caching this case.
            PropertyValueInfo::SetNoCache(info, instance);
            return true;
        }

        this->SetPropertyValueInfo(info, instance, index, attr);
        return true;
    }